

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O0

void __thiscall Encoder::DumpInlineeFrameMap(Encoder *this,size_t baseAddress)

{
  size_t baseAddress_local;
  Encoder *this_local;
  
  Output::Print(L"Inlinee frame info mapping\n");
  Output::Print(L"---------------------------------------\n");
  JsUtil::
  List<NativeOffsetInlineeFramePair,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
  ::Map<Encoder::DumpInlineeFrameMap(unsigned_long)::__0>
            ((List<NativeOffsetInlineeFramePair,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
              *)this->m_inlineeFrameMap,(anon_class_8_1_5655fa43)baseAddress);
  return;
}

Assistant:

void Encoder::DumpInlineeFrameMap(size_t baseAddress)
{
    Output::Print(_u("Inlinee frame info mapping\n"));
    Output::Print(_u("---------------------------------------\n"));
    m_inlineeFrameMap->Map([=](uint index, NativeOffsetInlineeFramePair& pair) {
        Output::Print(_u("%Ix"), baseAddress + pair.offset);
        Output::SkipToColumn(20);
        if (pair.record)
        {
            pair.record->Dump();
        }
        else
        {
            Output::Print(_u("<NULL>"));
        }
        Output::Print(_u("\n"));
    });
}